

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O0

void set_modflag(int mf)

{
  char cVar1;
  uint uVar2;
  char *local_18;
  char *basename;
  int mf_local;
  
  modflag = mf;
  if (main_window != (Fl_Window *)0x0) {
    if (filename == (char *)0x0) {
      local_18 = "Untitled.fl";
    }
    else {
      local_18 = strrchr(filename,0x2f);
      if (local_18 == (char *)0x0) {
        local_18 = filename;
      }
      else {
        local_18 = local_18 + 1;
      }
    }
    if (modflag == 0) {
      Fl_Window::label(main_window,local_18);
    }
    else {
      snprintf(set_modflag::title,0x800,"%s (modified)",local_18);
      Fl_Window::label(main_window,set_modflag::title);
    }
  }
  if (((sourceview_panel != (Fl_Double_Window *)0x0) &&
      (uVar2 = Fl_Widget::visible((Fl_Widget *)sourceview_panel), uVar2 != 0)) &&
     (cVar1 = Fl_Button::value(&sv_autorefresh->super_Fl_Button), cVar1 != '\0')) {
    Fl::remove_timeout(update_sourceview_timer,(void *)0x0);
    Fl::add_timeout(0.5,update_sourceview_timer,(void *)0x0);
  }
  if (modflag == 0) {
    Fl_Menu_Item::deactivate(save_item);
  }
  else {
    Fl_Menu_Item::activate(save_item);
  }
  return;
}

Assistant:

void set_modflag(int mf) {
  const char	*basename;
  static char	title[FL_PATH_MAX];

  modflag = mf;

  if (main_window) {
    if (!filename) basename = "Untitled.fl";
    else if ((basename = strrchr(filename, '/')) != NULL) basename ++;
#if defined(WIN32) || defined(__EMX__)
    else if ((basename = strrchr(filename, '\\')) != NULL) basename ++;
#endif // WIN32 || __EMX__
    else basename = filename;

    if (modflag) {
      snprintf(title, sizeof(title), "%s (modified)", basename);
      main_window->label(title);
    } else main_window->label(basename);
  }
  // if the UI was modified in any way, update the Source View panel
  if (sourceview_panel && sourceview_panel->visible() && sv_autorefresh->value())
  {
    // we will only update earliest 0.5 seconds after the last change, and only
    // if no other change was made, so dragging a widget will not generate any
    // CPU load
    Fl::remove_timeout(update_sourceview_timer, 0);
    Fl::add_timeout(0.5, update_sourceview_timer, 0);
  }

  // Enable/disable the Save menu item...
  if (modflag) save_item->activate();
  else save_item->deactivate();
}